

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::AtomEscapePass0
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this)

{
  EncodedChar **p;
  byte *pbVar1;
  EncodedChar *pEVar2;
  code *pcVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  OLECHAR OVar9;
  CharCount n;
  ulong in_RAX;
  undefined4 *puVar10;
  CharCount i;
  long lVar11;
  undefined8 uStack_38;
  Char c;
  bool surrogateEncountered;
  
  uStack_38 = in_RAX;
  if (this->inputLim < this->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar4) goto LAB_00edba94;
    *puVar10 = 0;
  }
  pbVar1 = this->next;
  if (((ulong)*pbVar1 == 0) && (this->inputLim <= pbVar1)) {
    Fail(this,-0x7ff5ec67);
    return false;
  }
  p = &this->next;
  if ((ASCIIChars::classes[*pbVar1] & 0x10) != 0) {
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      if (this->inputLim < this->next + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar4) goto LAB_00edba94;
        *puVar10 = 0;
      }
      if ((char)**p < '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                           "!this->IsMultiUnitChar(next[i])");
        if (!bVar4) goto LAB_00edba94;
        *puVar10 = 0;
      }
      pEVar2 = this->next;
      this->next = pEVar2 + 1;
      if (this->inputLim < pEVar2 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar4) goto LAB_00edba94;
        *puVar10 = 0;
      }
      if ((ASCIIChars::classes[**p] & 0x10) == 0) {
        return false;
      }
    } while( true );
  }
  if (this->inputLim < pbVar1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar4) goto LAB_00edba94;
    *puVar10 = 0;
  }
  pEVar2 = *p;
  if (*pEVar2 == 'c') {
    if (this->inputLim < pEVar2 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar4) goto LAB_00edba94;
      *puVar10 = 0;
    }
    if ((ASCIIChars::classes[(*p)[1]] & 8) == 0) {
      DeferredFailIfUnicode(this,-0x7ff5e9d6);
    }
    else {
      if (this->inputLim < *p + 2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar4) {
LAB_00edba94:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar10 = 0;
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      lVar11 = 0;
      do {
        if ((char)(*p)[lVar11] < '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                             "!this->IsMultiUnitChar(next[i])");
          if (!bVar4) goto LAB_00edba94;
          *puVar10 = 0;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 2);
      *p = *p + 2;
    }
  }
  else {
    if (this->inputLim <= pEVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x25d,"(!IsEOF())","!IsEOF()");
      if (!bVar4) goto LAB_00edba94;
      *puVar10 = 0;
    }
    OVar9 = UTF8EncodingPolicyBase<false>::ReadFull<true>
                      (&this->super_UTF8EncodingPolicyBase<false>,p,this->inputLim);
    uStack_38._0_6_ = CONCAT24(OVar9,(undefined4)uStack_38);
    if ((ushort)OVar9 < 0x75) {
      if (OVar9 == L'B') {
        return true;
      }
      if (OVar9 != L'b') {
        return false;
      }
      return true;
    }
    if (OVar9 == L'u') {
      uStack_38 = uStack_38 & 0xffffffffffffff;
      n = TryParseExtendedUnicodeEscape
                    (this,(Char *)((long)&uStack_38 + 4),(bool *)((long)&uStack_38 + 7),true);
      if ((int)n < 1) {
        if (this->inputLim < this->next + 4) {
          return false;
        }
        bVar5 = ECLookahead(this,0);
        if ((ASCIIChars::classes[bVar5] & 0x40) == 0) {
          return false;
        }
        bVar5 = ECLookahead(this,1);
        if ((ASCIIChars::classes[bVar5] & 0x40) == 0) {
          return false;
        }
        bVar5 = ECLookahead(this,2);
        if ((ASCIIChars::classes[bVar5] & 0x40) == 0) {
          return false;
        }
        bVar5 = ECLookahead(this,3);
        if ((ASCIIChars::classes[bVar5] & 0x40) == 0) {
          return false;
        }
        n = 4;
        if (((this->scriptContext->config).threadConfig)->m_ES6Unicode == true) {
          bVar5 = ECLookahead(this,0);
          bVar5 = ASCIIChars::values[bVar5];
          bVar6 = ECLookahead(this,1);
          bVar6 = ASCIIChars::values[bVar6];
          bVar7 = ECLookahead(this,2);
          bVar7 = ASCIIChars::values[bVar7];
          bVar8 = ECLookahead(this,3);
          TrackIfSurrogatePair
                    (this,(uint)(byte)ASCIIChars::values[bVar8] | (uint)bVar7 << 4 |
                          (uint)bVar6 << 8 | (uint)bVar5 << 0xc,this->next + -1,5);
        }
      }
      else {
        if (uStack_38._7_1_ != '\x01') {
          return false;
        }
        if ((this->ctAllocator != (ArenaAllocator *)0x0) &&
           (this->currentSurrogatePairNode == (SurrogatePairTracker *)0x0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x620,
                             "(this->ctAllocator == nullptr || this->currentSurrogatePairNode != nullptr)"
                             ,
                             "this->ctAllocator == nullptr || this->currentSurrogatePairNode != nullptr"
                            );
          if (!bVar4) goto LAB_00edba94;
          *puVar10 = 0;
        }
        if ((this->ctAllocator != (ArenaAllocator *)0x0) &&
           (pEVar2 != this->currentSurrogatePairNode->location)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x621,
                             "(this->ctAllocator == nullptr || current == this->currentSurrogatePairNode->location)"
                             ,
                             "this->ctAllocator == nullptr || current == this->currentSurrogatePairNode->location"
                            );
          if (!bVar4) goto LAB_00edba94;
          *puVar10 = 0;
        }
      }
    }
    else {
      if (OVar9 != L'x') {
        return false;
      }
      if (this->inputLim < this->next + 2) {
        return false;
      }
      if (this->inputLim < this->next) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar4) goto LAB_00edba94;
        *puVar10 = 0;
      }
      if ((ASCIIChars::classes[**p] & 0x40) == 0) {
        return false;
      }
      bVar5 = ECLookahead(this,1);
      if ((ASCIIChars::classes[bVar5] & 0x40) == 0) {
        return false;
      }
      n = 2;
    }
    ECConsume(this,n);
  }
  return false;
}

Assistant:

bool Parser<P, IsLiteral>::AtomEscapePass0()
    {
        EncodedChar ec = ECLookahead();
        if (ec == 0 && IsEOF())
        {
            // Terminating 0
            Fail(JSERR_RegExpSyntax);
            return false;
        }
        else if (standardEncodedChars->IsDigit(ec))
        {
            do
            {
                ECConsume();
            }
            while (standardEncodedChars->IsDigit(ECLookahead())); // terminating 0 is not a digit
            return false;
        }
        else if (ECLookahead() == 'c')
        {
            if (standardEncodedChars->IsLetter(ECLookahead(1))) // terminating 0 is not a letter
            {
                ECConsume(2);
            }
            else
            {
                DeferredFailIfUnicode(JSERR_RegExpInvalidEscape);
            }
            return false;
        }
        else
        {
            const EncodedChar *current = next;
            // An escaped '/' is ok
            Char c = NextChar();
            switch (c)
            {
            case 'b':
            case 'B':
                return true;
            // case 'c': handled as special case above
            case 'x':
                if (ECCanConsume(2) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)))
                    ECConsume(2);
                break;
            case 'u':
                bool surrogateEncountered = false;
                int lengthOfSurrogate = TryParseExtendedUnicodeEscape(c, surrogateEncountered, true);
                if (lengthOfSurrogate > 0)
                {
                    if (surrogateEncountered)
                    {
                        // If we don't have an allocator, we don't create nodes
                        // Asserts in place as extra checks for when we do have an allocator
                        Assert(this->ctAllocator == nullptr || this->currentSurrogatePairNode != nullptr);
                        Assert(this->ctAllocator == nullptr || current == this->currentSurrogatePairNode->location);
                        ECConsume(lengthOfSurrogate);
                    }
                    //Don't fall through
                    break;
                }
                else if (ECCanConsume(4) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)) &&
                    standardEncodedChars->IsHex(ECLookahead(2)) &&
                    standardEncodedChars->IsHex(ECLookahead(3)))
                {
                    if (this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                    {
                        codepoint_t value = (standardEncodedChars->DigitValue(ECLookahead(0)) << 12) |
                                            (standardEncodedChars->DigitValue(ECLookahead(1)) << 8) |
                                            (standardEncodedChars->DigitValue(ECLookahead(2)) << 4) |
                                            (standardEncodedChars->DigitValue(ECLookahead(3)));
                        TrackIfSurrogatePair(value, (next - 1), 5);
                    }
                    ECConsume(4);
                }
                break;
            }
            // embedded 0 is ok

            return false;
        }
    }